

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

int memcmp(void *__s1,void *__s2,size_t __n)

{
  size_t sVar1;
  
  if (__n != 0) {
    sVar1 = 0;
    do {
      if (*(byte *)((long)__s1 + sVar1) != *(byte *)((long)__s2 + sVar1)) {
        return (uint)*(byte *)((long)__s1 + sVar1) - (uint)*(byte *)((long)__s2 + sVar1);
      }
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return 0;
}

Assistant:

int memcmp(const void *lhs, const void *rhs, size_t count) {
    const unsigned char *lhs_ = lhs;
    const unsigned char *rhs_ = rhs;

    for (size_t i = 0; i < count; ++i) {
        const int res = lhs_[i] - rhs_[i];
        if (res != 0) {
            return res;
        }
    }

    return 0;
}